

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

UnlocalizedNumberFormatter *
icu_63::number::impl::skeleton::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,UnicodeString *skeletonString,
          UErrorCode *status)

{
  UBool UVar1;
  MacroProps macros;
  MacroProps MStack_3b8;
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> local_1f8;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (::(anonymous_namespace)::gNumberSkeletonsInitOnce != 2) {
      UVar1 = umtx_initImplPreInit((UInitOnce *)&::(anonymous_namespace)::gNumberSkeletonsInitOnce);
      if (UVar1 != '\0') {
        anon_unknown.dwarf_1a4554::initNumberSkeletons(status);
        DAT_003ecf04 = *status;
        umtx_initImplPostInit((UInitOnce *)&::(anonymous_namespace)::gNumberSkeletonsInitOnce);
        goto LAB_00269a9a;
      }
    }
    if (U_ZERO_ERROR < DAT_003ecf04) {
      *status = DAT_003ecf04;
    }
  }
LAB_00269a9a:
  parseSkeleton(&MStack_3b8,skeletonString,status);
  NumberFormatter::with();
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,&local_1f8,&MStack_3b8);
  Locale::~Locale(&local_1f8.fMacros.locale);
  Scale::~Scale(&local_1f8.fMacros.scale);
  SymbolsWrapper::~SymbolsWrapper(&local_1f8.fMacros.symbols);
  MeasureUnit::~MeasureUnit(&local_1f8.fMacros.perUnit);
  MeasureUnit::~MeasureUnit(&local_1f8.fMacros.unit);
  Locale::~Locale(&MStack_3b8.locale);
  Scale::~Scale(&MStack_3b8.scale);
  SymbolsWrapper::~SymbolsWrapper(&MStack_3b8.symbols);
  MeasureUnit::~MeasureUnit(&MStack_3b8.perUnit);
  MeasureUnit::~MeasureUnit(&MStack_3b8.unit);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter skeleton::create(const UnicodeString& skeletonString, UErrorCode& status) {
    umtx_initOnce(gNumberSkeletonsInitOnce, &initNumberSkeletons, status);
    MacroProps macros = parseSkeleton(skeletonString, status);
    return NumberFormatter::with().macros(macros);
}